

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O0

void __thiscall
CDirectiveData::setNormal
          (CDirectiveData *this,vector<Expression,_std::allocator<Expression>_> *entries,
          size_t unitSize)

{
  size_type __n;
  size_t local_20;
  size_t unitSize_local;
  vector<Expression,_std::allocator<Expression>_> *entries_local;
  CDirectiveData *this_local;
  
  local_20 = unitSize;
  unitSize_local = (size_t)entries;
  entries_local = (vector<Expression,_std::allocator<Expression>_> *)this;
  switch(unitSize) {
  case 1:
    this->mode = U8;
    break;
  case 2:
    this->mode = U16;
    break;
  default:
    Logger::printError<unsigned_long>
              ((Logger *)0x1,0x22cead,(char *)&local_20,
               (unsigned_long *)&switchD_0021919f::switchdataD_0022cd70);
    return;
  case 4:
    this->mode = U32;
    break;
  case 8:
    this->mode = U64;
  }
  std::vector<Expression,_std::allocator<Expression>_>::operator=(&this->entries,entries);
  this->writeTermination = false;
  __n = std::vector<Expression,_std::allocator<Expression>_>::size
                  ((vector<Expression,_std::allocator<Expression>_> *)unitSize_local);
  std::vector<long,_std::allocator<long>_>::reserve(&this->normalData,__n);
  return;
}

Assistant:

void CDirectiveData::setNormal(std::vector<Expression>& entries, size_t unitSize)
{
	switch (unitSize)
	{
	case 1:
		this->mode = EncodingMode::U8;
		break;
	case 2:
		this->mode = EncodingMode::U16;
		break;
	case 4:
		this->mode = EncodingMode::U32;
		break;
	case 8:
		this->mode = EncodingMode::U64;
		break;
	default:
		Logger::printError(Logger::Error, "Invalid data unit size %d",unitSize);
		return;
	}
	
	this->entries = entries;
	this->writeTermination = false;
	normalData.reserve(entries.size());
}